

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vhost.c
# Opt level: O1

void * lws_protocol_vh_priv_get(lws_vhost *vhost,lws_protocols *prot)

{
  uint uVar1;
  void **ppvVar2;
  char *__s2;
  int iVar3;
  lws_protocols *plVar4;
  ulong uVar5;
  ulong uVar6;
  lws_protocols *plVar7;
  void *pvVar8;
  bool bVar9;
  
  if ((((vhost == (lws_vhost *)0x0) || (plVar7 = vhost->protocols, plVar7 == (lws_protocols *)0x0))
      || (ppvVar2 = vhost->protocol_vh_privs,
         prot == (lws_protocols *)0x0 || ppvVar2 == (void **)0x0)) ||
     (__s2 = prot->name, __s2 == (char *)0x0)) {
    pvVar8 = (void *)0x0;
  }
  else {
    uVar1 = vhost->count_protocols;
    plVar4 = plVar7;
    uVar5 = 0;
    do {
      uVar6 = uVar5;
      if ((long)(int)uVar1 <= (long)uVar6) break;
      bVar9 = plVar4 != prot;
      plVar4 = plVar4 + 1;
      uVar5 = uVar6 + 1;
    } while (bVar9);
    if (uVar1 + 1 == (int)(uVar6 + 1)) {
      if ((int)uVar1 < 1) {
        uVar6 = 0;
      }
      else {
        uVar5 = 0;
        do {
          if ((plVar7->name != (char *)0x0) &&
             (iVar3 = strcmp(plVar7->name,__s2), uVar6 = uVar5, iVar3 == 0)) break;
          uVar5 = uVar5 + 1;
          plVar7 = plVar7 + 1;
          uVar6 = (ulong)uVar1;
        } while (uVar1 != uVar5);
      }
      if ((uint)uVar6 == uVar1) {
        _lws_log_cx((vhost->lc).log_cx,lws_log_prepend_vhost,vhost,1,"lws_protocol_vh_priv_get",
                    "unknown protocol %p",prot);
        return (void *)0x0;
      }
    }
    pvVar8 = ppvVar2[uVar6 & 0xffffffff];
  }
  return pvVar8;
}

Assistant:

void *
lws_protocol_vh_priv_get(struct lws_vhost *vhost,
			 const struct lws_protocols *prot)
{
	int n = 0;

	if (!vhost || !vhost->protocols ||
	    !vhost->protocol_vh_privs || !prot || !prot->name)
		return NULL;

	while (n < vhost->count_protocols && &vhost->protocols[n] != prot)
		n++;

	if (n == vhost->count_protocols) {
		n = 0;
		while (n < vhost->count_protocols) {
			if (vhost->protocols[n].name &&
			    !strcmp(vhost->protocols[n].name, prot->name))
				break;
			n++;
		}

		if (n == vhost->count_protocols) {
			lwsl_vhost_err(vhost, "unknown protocol %p", prot);
			return NULL;
		}
	}

	return vhost->protocol_vh_privs[n];
}